

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

void * tcmalloc::MetaDataAlloc(size_t bytes)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  ulong local_30;
  size_t real_size;
  SpinLockHolder h;
  
  if (0x7fffff < bytes) {
    pvVar1 = TCMalloc_SystemAlloc(bytes,(size_t *)0x0,0x40);
    if (pvVar1 == (void *)0x0) {
      return (void *)0x0;
    }
    metadata_system_bytes_ = metadata_system_bytes_ + bytes;
    return pvVar1;
  }
  real_size = (size_t)&metadata_alloc_lock;
  LOCK();
  bVar4 = metadata_alloc_lock == 0;
  if (bVar4) {
    metadata_alloc_lock = 1;
  }
  UNLOCK();
  if (!bVar4) {
    SpinLock::SlowLock((SpinLock *)&metadata_alloc_lock);
  }
  uVar3 = (ulong)(-(int)metadata_chunk_alloc_ & 0x3f);
  if (metadata_chunk_avail_ < uVar3 + bytes) {
    pvVar1 = TCMalloc_SystemAlloc(0x800000,&local_30,0x40);
    if (pvVar1 == (void *)0x0) {
      pvVar1 = (void *)0x0;
      goto LAB_0011669f;
    }
    metadata_chunk_avail_ = local_30;
    uVar3 = 0;
    metadata_chunk_alloc_ = pvVar1;
  }
  pvVar1 = (void *)((long)metadata_chunk_alloc_ + uVar3);
  lVar2 = bytes + uVar3;
  metadata_chunk_alloc_ = (void *)((long)metadata_chunk_alloc_ + lVar2);
  metadata_chunk_avail_ = metadata_chunk_avail_ - lVar2;
  metadata_system_bytes_ = metadata_system_bytes_ + lVar2;
LAB_0011669f:
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&real_size);
  return pvVar1;
}

Assistant:

void* MetaDataAlloc(size_t bytes) {
  if (bytes >= kMetadataAllocChunkSize) {
    void *rv = TCMalloc_SystemAlloc(bytes,
                                    nullptr, kMetadataAllignment);
    if (rv != nullptr) {
      metadata_system_bytes_ += bytes;
    }
    return rv;
  }

  SpinLockHolder h(&metadata_alloc_lock);

  // the following works by essentially turning address to integer of
  // log_2 kMetadataAllignment size and negating it. I.e. negated
  // value + original value gets 0 and that's what we want modulo
  // kMetadataAllignment. Note, we negate before masking higher bits
  // off, otherwise we'd have to mask them off after negation anyways.
  intptr_t alignment = -reinterpret_cast<intptr_t>(metadata_chunk_alloc_) & (kMetadataAllignment-1);

  if (metadata_chunk_avail_ < bytes + alignment) {
    size_t real_size;
    void *ptr = TCMalloc_SystemAlloc(kMetadataAllocChunkSize,
                                     &real_size, kMetadataAllignment);
    if (ptr == nullptr) {
      return nullptr;
    }

    metadata_chunk_alloc_ = static_cast<char *>(ptr);
    metadata_chunk_avail_ = real_size;

    alignment = 0;
  }

  void *rv = static_cast<void *>(metadata_chunk_alloc_ + alignment);
  bytes += alignment;
  metadata_chunk_alloc_ += bytes;
  metadata_chunk_avail_ -= bytes;
  metadata_system_bytes_ += bytes;
  return rv;
}